

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gaussian_mixture_modeling.cc
# Opt level: O1

bool __thiscall
sptk::GaussianMixtureModeling::Run
          (GaussianMixtureModeling *this,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *input_vectors,vector<double,_std::allocator<double>_> *weights,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *mean_vectors,
          vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *covariance_matrices
          ,double *total_log_likelihood)

{
  double dVar1;
  InitializationType IVar2;
  void *__s;
  void *pvVar3;
  pointer pdVar4;
  pointer pvVar5;
  pointer pvVar6;
  pointer pdVar7;
  bool bVar8;
  double dVar9;
  bool bVar10;
  int iVar11;
  SymmetricMatrix *pSVar12;
  double *pdVar13;
  double dVar14;
  ostream *poVar15;
  uint uVar16;
  size_type __new_size;
  ulong uVar17;
  uint uVar18;
  int iVar19;
  uint uVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  ulong uVar24;
  Row local_200;
  double local_1e8;
  double local_1e0;
  vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *local_1d8;
  double local_1d0;
  ulong local_1c8;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_1c0;
  double local_1b8;
  double local_1b0;
  double local_1a8;
  double local_1a0;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_198;
  double local_190;
  vector<double,_std::allocator<double>_> buffer0;
  double local_150;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  buffer1;
  vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> buffer2;
  double denominator;
  pointer local_108;
  uint local_100;
  double *local_f8;
  long local_f0;
  double local_e8;
  long local_e0;
  ulong local_d8;
  double local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  vector<double,_std::allocator<double>_> numerators;
  Buffer buffer;
  
  if (this->is_valid_ == true) {
    if (total_log_likelihood == (double *)0x0) {
      return false;
    }
    if (covariance_matrices ==
        (vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *)0x0) {
      return false;
    }
    if (mean_vectors ==
        (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
         *)0x0) {
      return false;
    }
    if (weights == (vector<double,_std::allocator<double>_> *)0x0) {
      return false;
    }
    if ((input_vectors->
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start ==
        (input_vectors->
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      return false;
    }
    __new_size = (long)this->num_order_ + 1;
    IVar2 = this->initialization_type_;
    iVar19 = (int)__new_size;
    local_1d8 = covariance_matrices;
    local_1c0 = input_vectors;
    local_f8 = total_log_likelihood;
    if (IVar2 == kUbm) {
      std::vector<double,_std::allocator<double>_>::operator=(weights,&this->ubm_weights_);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::operator=(mean_vectors,&this->ubm_mean_vectors_);
      std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::operator=
                (local_1d8,&this->ubm_covariance_matrices_);
    }
    else {
      if (IVar2 == kKMeans) {
        bVar10 = Initialize(this,input_vectors,weights,mean_vectors,covariance_matrices);
      }
      else {
        if (IVar2 != kNone) goto LAB_00108a6d;
        bVar10 = anon_unknown.dwarf_23245::CheckGmm
                           (this->num_mixture_,iVar19,weights,mean_vectors,covariance_matrices);
      }
      if (bVar10 == false) goto LAB_00108a6d;
    }
    std::vector<double,_std::allocator<double>_>::vector
              (&buffer0,(long)this->num_mixture_,(allocator_type *)&buffer);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::vector(&buffer1,(long)this->num_mixture_,(allocator_type *)&buffer);
    iVar11 = this->num_mixture_;
    if (0 < iVar11) {
      lVar21 = 0;
      lVar22 = 0;
      do {
        std::vector<double,_std::allocator<double>_>::resize
                  ((vector<double,_std::allocator<double>_> *)
                   ((long)&((buffer1.
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data._M_start + lVar21),__new_size);
        lVar22 = lVar22 + 1;
        iVar11 = this->num_mixture_;
        lVar21 = lVar21 + 0x18;
      } while (lVar22 < iVar11);
    }
    std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::vector
              (&buffer2,(long)iVar11,(allocator_type *)&buffer);
    iVar11 = this->num_mixture_;
    if (0 < iVar11) {
      lVar21 = 0;
      lVar22 = 0;
      do {
        SymmetricMatrix::Resize
                  ((SymmetricMatrix *)
                   ((long)&(buffer2.
                            super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                            ._M_impl.super__Vector_impl_data._M_start)->_vptr_SymmetricMatrix +
                   lVar21),iVar19);
        lVar22 = lVar22 + 1;
        iVar11 = this->num_mixture_;
        lVar21 = lVar21 + 0x40;
      } while (lVar22 < iVar11);
    }
    buffer._vptr_Buffer = (_func_int **)&PTR__Buffer_0011faf0;
    buffer.d_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    buffer.d_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    buffer.d_.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    buffer.gconsts_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    buffer.gconsts_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    buffer.gconsts_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    buffer.precisions_.
    super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    buffer.precisions_.
    super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>._M_impl.
    super__Vector_impl_data._M_finish._0_1_ = 0;
    buffer.precisions_.
    super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>._M_impl.
    super__Vector_impl_data._M_finish._1_7_ = 0;
    buffer.precisions_.
    super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    buffer._73_8_ = 0;
    std::vector<double,_std::allocator<double>_>::vector
              (&numerators,(long)iVar11,(allocator_type *)&local_200);
    if (this->num_iteration_ < 1) {
      bVar10 = true;
    }
    else {
      pSVar12 = &this->mask_;
      local_1c8 = 1;
      local_150 = -1.79769313486232e+308;
      local_198 = mean_vectors;
      do {
        if (buffer0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start !=
            buffer0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          memset(buffer0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start,0,
                 ((long)buffer0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_finish +
                  (-8 - (long)buffer0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start) & 0xfffffffffffffff8U) + 8);
        }
        if (0 < this->num_mixture_) {
          lVar22 = 8;
          lVar23 = 0;
          lVar21 = 0;
          do {
            __s = *(void **)((long)buffer1.
                                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar22 + -8);
            pvVar3 = *(void **)((long)&((buffer1.
                                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->
                                       super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                       super__Vector_impl_data._M_start + lVar22);
            if (__s != pvVar3) {
              memset(__s,0,((long)pvVar3 + (-8 - (long)__s) & 0xfffffffffffffff8U) + 8);
            }
            SymmetricMatrix::Fill
                      ((SymmetricMatrix *)
                       ((long)&(buffer2.
                                super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_vptr_SymmetricMatrix +
                       lVar23),0.0);
            lVar21 = lVar21 + 1;
            lVar22 = lVar22 + 0x18;
            lVar23 = lVar23 + 0x40;
          } while (lVar21 < this->num_mixture_);
        }
        buffer._73_8_ = buffer._73_8_ & 0xffffffffffffff;
        uVar16 = (int)((long)(local_1c0->
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(local_1c0->
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x55555555;
        local_190 = (double)CONCAT44(local_190._4_4_,0xf);
        uVar17 = (ulong)(0 < (int)uVar16);
        if ((int)uVar16 < 1) {
          local_1d0 = 0.0;
        }
        else {
          local_1b0 = (double)(ulong)(uVar16 & 0x7fffffff);
          local_1d0 = 0.0;
          dVar14 = 0.0;
          do {
            local_1e0 = dVar14;
            bVar10 = CalculateLogProbability
                               (this->num_order_,this->num_mixture_,this->is_diagonal_,false,
                                (local_1c0->
                                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + (long)dVar14,weights,
                                mean_vectors,local_1d8,&numerators,&denominator,&buffer);
            if ((bVar10) && (local_1d0 = local_1d0 + denominator, 0 < this->num_mixture_)) {
              local_1b8 = (double)CONCAT71(local_1b8._1_7_,(char)uVar17);
              lVar21 = *(long *)&(local_1c0->
                                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start[(long)dVar14].
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data;
              lVar22 = 0;
              do {
                local_1a8 = exp(numerators.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start[lVar22] - denominator);
                buffer0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar22] =
                     buffer0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar22] + local_1a8;
                uVar18 = this->num_order_;
                if (-1 < (int)uVar18) {
                  pdVar4 = buffer1.
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[lVar22].
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  lVar23 = 0;
                  do {
                    pdVar4[lVar23] = *(double *)(lVar21 + lVar23 * 8) * local_1a8 + pdVar4[lVar23];
                    lVar23 = lVar23 + 1;
                  } while ((ulong)uVar18 + 1 != lVar23);
                }
                if (-1 < this->num_order_) {
                  uVar17 = 0;
                  do {
                    uVar18 = (uint)uVar17;
                    uVar24 = 0;
                    if (this->is_diagonal_ != false) {
                      uVar24 = uVar17 & 0xffffffff;
                    }
                    uVar20 = (uint)uVar24;
                    if ((uint)uVar24 <= uVar18) {
                      uVar20 = uVar18;
                    }
                    do {
                      local_200._vptr_Row = (_func_int **)&PTR__Row_0011fac0;
                      local_200.matrix_ = pSVar12;
                      local_200.row_ = uVar18;
                      pdVar13 = SymmetricMatrix::Row::operator[](&local_200,(int)uVar24);
                      if ((*pdVar13 != 0.0) || (NAN(*pdVar13))) {
                        local_1e8 = *(double *)(lVar21 + uVar17 * 8);
                        local_200.matrix_ =
                             buffer2.
                             super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar22;
                        local_1a0 = *(double *)(lVar21 + uVar24 * 8);
                        local_200._vptr_Row = (_func_int **)&PTR__Row_0011fac0;
                        local_200.row_ = uVar18;
                        pdVar13 = SymmetricMatrix::Row::operator[](&local_200,(int)uVar24);
                        *pdVar13 = local_1e8 * local_1a8 * local_1a0 + *pdVar13;
                      }
                      uVar24 = uVar24 + 1;
                    } while (uVar20 + 1 != uVar24);
                    bVar8 = (long)uVar17 < (long)this->num_order_;
                    uVar17 = uVar17 + 1;
                  } while (bVar8);
                }
                lVar22 = lVar22 + 1;
              } while (lVar22 < this->num_mixture_);
              uVar17 = (ulong)local_1b8 & 0xff;
              mean_vectors = local_198;
            }
            if (!bVar10) {
              local_190 = (double)CONCAT44(local_190._4_4_,1);
              break;
            }
            dVar14 = (double)((long)local_1e0 + 1);
            uVar17 = (ulong)((ulong)dVar14 < (ulong)local_1b0);
          } while (dVar14 != local_1b0);
        }
        if ((uVar17 & 1) == 0) {
          dVar14 = this->smoothing_parameter_;
          dVar9 = (double)(int)uVar16;
          if ((dVar14 != 0.0) || (NAN(dVar14))) {
            iVar19 = this->num_mixture_;
            if (0 < (long)iVar19) {
              pdVar4 = (this->xi_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
              pdVar7 = (weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              lVar21 = 0;
              do {
                pdVar7[lVar21] =
                     (buffer0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar21] + pdVar4[lVar21]) *
                     (1.0 / (dVar14 + dVar9));
                lVar21 = lVar21 + 1;
              } while (iVar19 != lVar21);
            }
          }
          else {
            iVar19 = this->num_mixture_;
            if (0 < (long)iVar19) {
              pdVar4 = (weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              lVar21 = 0;
              do {
                pdVar4[lVar21] =
                     buffer0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar21] * (1.0 / dVar9);
                lVar21 = lVar21 + 1;
              } while (iVar19 != lVar21);
            }
          }
          FloorWeight(this,weights);
          uVar16 = this->num_mixture_;
          if ((this->smoothing_parameter_ != 0.0) || (NAN(this->smoothing_parameter_))) {
            if (0 < (int)uVar16) {
              pvVar5 = (mean_vectors->
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              pdVar4 = (this->xi_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
              iVar19 = this->num_order_;
              pvVar6 = (this->ubm_mean_vectors_).
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              uVar17 = 0;
              do {
                if (-1 < iVar19) {
                  dVar14 = buffer0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar17];
                  dVar1 = pdVar4[uVar17];
                  lVar21 = *(long *)&pvVar5[uVar17].
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data;
                  pdVar7 = buffer1.
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar17].
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  lVar22 = *(long *)&pvVar6[uVar17].
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data;
                  uVar24 = 0;
                  do {
                    *(double *)(lVar21 + uVar24 * 8) =
                         (pdVar4[uVar17] * *(double *)(lVar22 + uVar24 * 8) + pdVar7[uVar24]) *
                         (1.0 / (dVar14 + dVar1));
                    uVar24 = uVar24 + 1;
                  } while (iVar19 + 1 != uVar24);
                }
                uVar17 = uVar17 + 1;
              } while (uVar17 != uVar16);
            }
          }
          else if (0 < (int)uVar16) {
            pvVar5 = (mean_vectors->
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            iVar19 = this->num_order_;
            uVar17 = 0;
            do {
              if (-1 < iVar19) {
                lVar21 = *(long *)&pvVar5[uVar17].
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data;
                dVar14 = buffer0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar17];
                pdVar4 = buffer1.
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar17].
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start;
                uVar24 = 0;
                do {
                  *(double *)(lVar21 + uVar24 * 8) = pdVar4[uVar24] * (1.0 / dVar14);
                  uVar24 = uVar24 + 1;
                } while (iVar19 + 1 != uVar24);
              }
              uVar17 = uVar17 + 1;
            } while (uVar17 != uVar16);
          }
          if ((this->smoothing_parameter_ != 0.0) || (NAN(this->smoothing_parameter_))) {
            if (0 < this->num_mixture_) {
              lVar21 = 0;
              do {
                if (-1 < this->num_order_) {
                  local_1e8 = (double)(lVar21 * 3);
                  lVar22 = *(long *)&(local_198->
                                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start[lVar21].
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data;
                  local_e8 = 1.0 / (buffer0.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_start[lVar21] +
                                   (this->xi_).super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_start[lVar21]);
                  uVar17 = 0;
                  local_f0 = lVar21;
                  local_e0 = lVar22;
                  do {
                    uVar16 = (uint)uVar17;
                    uVar24 = 0;
                    if (this->is_diagonal_ != false) {
                      uVar24 = uVar17 & 0xffffffff;
                    }
                    uVar18 = (uint)uVar24;
                    if ((uint)uVar24 <= uVar16) {
                      uVar18 = uVar16;
                    }
                    local_d8 = (ulong)(uVar18 + 1);
                    do {
                      local_200._vptr_Row = (_func_int **)&PTR__Row_0011fac0;
                      iVar19 = (int)uVar24;
                      local_200.matrix_ = pSVar12;
                      local_200.row_ = uVar16;
                      pdVar13 = SymmetricMatrix::Row::operator[](&local_200,iVar19);
                      if ((*pdVar13 != 0.0) || (NAN(*pdVar13))) {
                        pdVar4 = (&((buffer1.
                                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                   super__Vector_impl_data._M_start)[(long)local_1e8];
                        local_1a0 = pdVar4[uVar17];
                        local_1e0 = buffer0.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_start[lVar21];
                        local_1a8 = pdVar4[uVar24];
                        local_200.matrix_ =
                             buffer2.
                             super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar21;
                        local_200._vptr_Row = (_func_int **)&PTR__Row_0011fac0;
                        local_200.row_ = uVar16;
                        pdVar13 = SymmetricMatrix::Row::operator[](&local_200,iVar19);
                        local_1b8 = *pdVar13;
                        dVar14 = buffer0.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                 .super__Vector_impl_data._M_start[lVar21];
                        dVar1 = *(double *)(lVar22 + uVar24 * 8);
                        local_190 = *(double *)(lVar22 + uVar17 * 8);
                        local_1b0 = (this->xi_).super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_start[lVar21];
                        local_200.matrix_ =
                             (this->ubm_covariance_matrices_).
                             super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar21;
                        local_200._vptr_Row = (_func_int **)&PTR__Row_0011fac0;
                        local_200.row_ = uVar16;
                        pdVar13 = SymmetricMatrix::Row::operator[](&local_200,iVar19);
                        lVar22 = local_e0;
                        local_c0 = *pdVar13;
                        local_b0 = (this->xi_).super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_start[lVar21];
                        lVar23 = *(long *)((long)&(((this->ubm_mean_vectors_).
                                                                                                        
                                                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  )._M_impl.super__Vector_impl_data +
                                          (long)local_1e8 * 8);
                        local_b8 = *(double *)(lVar23 + uVar17 * 8);
                        local_c8 = *(double *)(local_e0 + uVar17 * 8);
                        local_a8 = *(double *)(lVar23 + uVar24 * 8);
                        local_200.matrix_ =
                             (local_1d8->
                             super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                             )._M_impl.super__Vector_impl_data._M_start + lVar21;
                        local_d0 = *(double *)(local_e0 + uVar24 * 8);
                        local_200._vptr_Row = (_func_int **)&PTR__Row_0011fac0;
                        local_200.row_ = uVar16;
                        pdVar13 = SymmetricMatrix::Row::operator[](&local_200,iVar19);
                        *pdVar13 = ((local_a8 - local_d0) * local_b0 * (local_b8 - local_c8) +
                                   local_1b0 * local_c0 +
                                   (local_1b8 -
                                   dVar14 * (((local_1a0 / local_1e0) * dVar1 +
                                             (local_1a8 / local_1e0) * local_190) -
                                            local_190 * dVar1))) * local_e8;
                        lVar21 = local_f0;
                      }
                      uVar24 = uVar24 + 1;
                    } while (local_d8 != uVar24);
                    bVar10 = (long)uVar17 < (long)this->num_order_;
                    uVar17 = uVar17 + 1;
                  } while (bVar10);
                }
                lVar21 = lVar21 + 1;
              } while (lVar21 < this->num_mixture_);
            }
          }
          else if (0 < this->num_mixture_) {
            local_1e0 = 0.0;
            do {
              if (-1 < this->num_order_) {
                local_1b0 = *(double *)
                             &(local_198->
                              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start[(long)local_1e0].
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data;
                local_1b8 = 1.0 / buffer0.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start[(long)local_1e0];
                uVar17 = 0;
                do {
                  uVar16 = (uint)uVar17;
                  uVar24 = 0;
                  if (this->is_diagonal_ != false) {
                    uVar24 = uVar17 & 0xffffffff;
                  }
                  uVar18 = (uint)uVar24;
                  if ((uint)uVar24 <= uVar16) {
                    uVar18 = uVar16;
                  }
                  do {
                    local_200._vptr_Row = (_func_int **)&PTR__Row_0011fac0;
                    iVar19 = (int)uVar24;
                    local_200.matrix_ = pSVar12;
                    local_200.row_ = uVar16;
                    pdVar13 = SymmetricMatrix::Row::operator[](&local_200,iVar19);
                    dVar14 = local_1e0;
                    if ((*pdVar13 != 0.0) || (NAN(*pdVar13))) {
                      local_200.matrix_ =
                           buffer2.
                           super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                           ._M_impl.super__Vector_impl_data._M_start + (long)local_1e0;
                      local_200._vptr_Row = (_func_int **)&PTR__Row_0011fac0;
                      local_200.row_ = uVar16;
                      pdVar13 = SymmetricMatrix::Row::operator[](&local_200,iVar19);
                      local_1e8 = *pdVar13;
                      local_1a0 = *(double *)((long)local_1b0 + uVar17 * 8);
                      local_108 = (local_1d8->
                                  super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                                  )._M_impl.super__Vector_impl_data._M_start + (long)dVar14;
                      local_1a8 = *(double *)((long)local_1b0 + uVar24 * 8);
                      denominator = (double)&PTR__Row_0011fac0;
                      local_100 = uVar16;
                      pdVar13 = SymmetricMatrix::Row::operator[]((Row *)&denominator,iVar19);
                      *pdVar13 = local_1e8 * local_1b8 - local_1a8 * local_1a0;
                    }
                    uVar24 = uVar24 + 1;
                  } while (uVar18 + 1 != uVar24);
                  bVar10 = (long)uVar17 < (long)this->num_order_;
                  uVar17 = uVar17 + 1;
                } while (bVar10);
              }
              local_1e0 = (double)((long)local_1e0 + 1);
            } while ((long)local_1e0 < (long)this->num_mixture_);
          }
          FloorVariance(this,local_1d8);
          mean_vectors = local_198;
          *local_f8 = local_1d0;
          local_1d0 = local_1d0 / dVar9;
          local_1e8 = local_1d0 - local_150;
          if ((int)((long)((ulong)(uint)((int)local_1c8 >> 0x1f) << 0x20 | local_1c8 & 0xffffffff) %
                   (long)this->log_interval_) == 0) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"iter ",5);
            *(undefined8 *)(std::ios_base::Init::~Init + *(long *)(std::cerr + -0x18)) = 3;
            poVar15 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,(int)local_1c8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar15," : ",3);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"average = ",10);
            std::ostream::_M_insert<double>(local_1d0);
            poVar15 = (ostream *)&std::cerr;
            if ((int)local_1c8 != 1) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,", change = ",0xb);
              poVar15 = std::ostream::_M_insert<double>(local_1e8);
            }
            std::endl<char,std::char_traits<char>>(poVar15);
          }
          if (this->convergence_threshold_ <= local_1e8) {
            local_150 = local_1d0;
          }
          iVar19 = (uint)(local_1e8 < this->convergence_threshold_) * 9;
        }
        else {
          iVar19 = local_190._0_4_;
        }
        if (iVar19 != 0) goto LAB_001097c6;
        iVar19 = (int)local_1c8;
        local_1c8 = (ulong)(iVar19 + 1);
      } while (iVar19 < this->num_iteration_);
      iVar19 = 9;
LAB_001097c6:
      bVar10 = iVar19 == 9;
    }
    if (numerators.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(numerators.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    Buffer::~Buffer(&buffer);
    std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::~vector(&buffer2);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector(&buffer1);
    if (buffer0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(buffer0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  else {
LAB_00108a6d:
    bVar10 = false;
  }
  return bVar10;
}

Assistant:

bool GaussianMixtureModeling::Run(
    const std::vector<std::vector<double> >& input_vectors,
    std::vector<double>* weights,
    std::vector<std::vector<double> >* mean_vectors,
    std::vector<SymmetricMatrix>* covariance_matrices,
    double* total_log_likelihood) const {
  // Check inputs.
  if (!is_valid_ || input_vectors.empty() || NULL == weights ||
      NULL == mean_vectors || NULL == covariance_matrices ||
      NULL == total_log_likelihood) {
    return false;
  }

  // Initialize GMM parameters.
  const int length(num_order_ + 1);
  switch (initialization_type_) {
    case kNone: {
      if (!CheckGmm(num_mixture_, length, *weights, *mean_vectors,
                    *covariance_matrices)) {
        return false;
      }
      break;
    }
    case kKMeans: {
      if (!Initialize(input_vectors, weights, mean_vectors,
                      covariance_matrices)) {
        return false;
      }
      break;
    }
    case kUbm: {
      *weights = ubm_weights_;
      *mean_vectors = ubm_mean_vectors_;
      *covariance_matrices = ubm_covariance_matrices_;
      break;
    }
    default: {
      return false;
    }
  }

  // Prepare memories.
  std::vector<double> buffer0(num_mixture_);
  std::vector<std::vector<double> > buffer1(num_mixture_);
  for (int k(0); k < num_mixture_; ++k) {
    buffer1[k].resize(length);
  }
  std::vector<SymmetricMatrix> buffer2(num_mixture_);
  for (int k(0); k < num_mixture_; ++k) {
    buffer2[k].Resize(length);
  }
  GaussianMixtureModeling::Buffer buffer;
  std::vector<double> numerators(num_mixture_);

  double prev_log_likelihood(sptk::kMin);

  for (int n(1); n <= num_iteration_; ++n) {
    // Clear buffers.
    std::fill(buffer0.begin(), buffer0.end(), 0.0);
    for (int k(0); k < num_mixture_; ++k) {
      std::fill(buffer1[k].begin(), buffer1[k].end(), 0.0);
      buffer2[k].Fill(0.0);
    }
    buffer.precomputed_ = false;

    // Perform E-step.
    double log_likelihood(0.0);
    const int num_data(static_cast<int>(input_vectors.size()));
    for (int t(0); t < num_data; ++t) {
      // Compute log-likelihood of data.
      double denominator;
      if (!CalculateLogProbability(num_order_, num_mixture_, is_diagonal_,
                                   false, input_vectors[t], *weights,
                                   *mean_vectors, *covariance_matrices,
                                   &numerators, &denominator, &buffer)) {
        return false;
      }
      log_likelihood += denominator;

      const double* x(&(input_vectors[t][0]));
      for (int k(0); k < num_mixture_; ++k) {
        const double posterior(std::exp(numerators[k] - denominator));

        // Accumulate zeroth-order statistics.
        buffer0[k] += posterior;

        // Accumulate first-order statistics.
        for (int l(0); l <= num_order_; ++l) {
          buffer1[k][l] += posterior * x[l];
        }

        // Accumulate second-order statistics.
        for (int l(0); l <= num_order_; ++l) {
          for (int m(is_diagonal_ ? l : 0); m <= l; ++m) {
            if (0.0 != mask_[l][m]) {
              buffer2[k][l][m] += posterior * x[l] * x[m];
            }
          }
        }
      }
    }

    // Update mixture weights.
    if (0.0 == smoothing_parameter_) {
      const double z(1.0 / num_data);
      for (int k(0); k < num_mixture_; ++k) {
        (*weights)[k] = buffer0[k] * z;
      }
    } else {
      const double z(1.0 / (num_data + smoothing_parameter_));
      for (int k(0); k < num_mixture_; ++k) {
        (*weights)[k] = (buffer0[k] + xi_[k]) * z;
      }
    }
    FloorWeight(weights);

    // Update mean vectors.
    if (0.0 == smoothing_parameter_) {
      for (int k(0); k < num_mixture_; ++k) {
        double* mu(&((*mean_vectors)[k][0]));
        const double z(1.0 / buffer0[k]);
        for (int l(0); l <= num_order_; ++l) {
          mu[l] = buffer1[k][l] * z;
        }
      }
    } else {
      for (int k(0); k < num_mixture_; ++k) {
        double* mu(&((*mean_vectors)[k][0]));
        const double z(1.0 / (buffer0[k] + xi_[k]));
        for (int l(0); l <= num_order_; ++l) {
          mu[l] = (buffer1[k][l] + xi_[k] * ubm_mean_vectors_[k][l]) * z;
        }
      }
    }

    // Update covariance matrices.
    if (0.0 == smoothing_parameter_) {
      for (int k(0); k < num_mixture_; ++k) {
        const double* mu(&((*mean_vectors)[k][0]));
        const double z(1.0 / buffer0[k]);
        for (int l(0); l <= num_order_; ++l) {
          for (int m(is_diagonal_ ? l : 0); m <= l; ++m) {
            if (0.0 != mask_[l][m]) {
              (*covariance_matrices)[k][l][m] =
                  buffer2[k][l][m] * z - (mu[l] * mu[m]);
            }
          }
        }
      }
    } else {
      for (int k(0); k < num_mixture_; ++k) {
        const double* mu(&((*mean_vectors)[k][0]));
        const double z(1.0 / (buffer0[k] + xi_[k]));
        for (int l(0); l <= num_order_; ++l) {
          for (int m(is_diagonal_ ? l : 0); m <= l; ++m) {
            if (0.0 != mask_[l][m]) {
              const double mu_l(buffer1[k][l] / buffer0[k]);
              const double mu_m(buffer1[k][m] / buffer0[k]);
              const double a(buffer2[k][l][m] -
                             buffer0[k] *
                                 (mu_l * mu[m] + mu[l] * mu_m - mu[l] * mu[m]));
              const double b(xi_[k] * ubm_covariance_matrices_[k][l][m]);
              const double c(xi_[k] * (ubm_mean_vectors_[k][l] - mu[l]) *
                             (ubm_mean_vectors_[k][m] - mu[m]));
              (*covariance_matrices)[k][l][m] = (a + b + c) * z;
            }
          }
        }
      }
    }
    FloorVariance(covariance_matrices);

    // Check convergence.
    *total_log_likelihood = log_likelihood;
    log_likelihood /= num_data;
    const double change(log_likelihood - prev_log_likelihood);
    if (0 == n % log_interval_) {
      std::cerr << "iter " << std::setw(3) << n << " : ";
      std::cerr << "average = " << log_likelihood;
      if (1 == n) {
        std::cerr << std::endl;
      } else {
        std::cerr << ", change = " << change << std::endl;
      }
    }
    if (change < convergence_threshold_) {
      break;
    }
    prev_log_likelihood = log_likelihood;
  }

  return true;
}